

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_clear(secp256k1_fe *a)

{
  int local_14;
  int i;
  secp256k1_fe *a_local;
  
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    a->n[local_14] = 0;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_clear(secp256k1_fe *a) {
    int i;
#ifdef VERIFY
    a->magnitude = 0;
    a->normalized = 1;
#endif
    for (i=0; i<5; i++) {
        a->n[i] = 0;
    }
}